

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O3

void raviX_show_linearizer(LinearizerState *linearizer,TextBuffer *mb)

{
  Proc *proc;
  PtrListIterator prociter__;
  PtrListIterator local_30;
  
  output_proc(linearizer->main_proc,mb);
  raviX_ptrlist_forward_iterator(&local_30,(PtrList *)linearizer->all_procs);
  proc = (Proc *)raviX_ptrlist_iter_next(&local_30);
  if (proc != (Proc *)0x0) {
    do {
      if (proc != linearizer->main_proc) {
        output_proc(proc,mb);
      }
      proc = (Proc *)raviX_ptrlist_iter_next(&local_30);
    } while (proc != (Proc *)0x0);
  }
  return;
}

Assistant:

void raviX_show_linearizer(LinearizerState *linearizer, TextBuffer *mb)
{
	output_proc(linearizer->main_proc, mb);
	Proc *proc;
	FOR_EACH_PTR(linearizer->all_procs, Proc, proc)
	{
		if (proc == linearizer->main_proc)
			continue;
		output_proc(proc, mb);
	}
	END_FOR_EACH_PTR(proc)
}